

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

void __thiscall
LowererMDArch::GeneratePreCall
          (LowererMDArch *this,Instr *callInstr,Opnd *functionObjOpnd,
          Instr *insertBeforeInstrForCFGCheck)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  DWORD DVar4;
  RegOpnd *pRVar5;
  IndirOpnd *pIVar6;
  Instr *pIVar7;
  AddrOpnd *pAVar8;
  undefined4 *puVar9;
  Opnd *dstOpnd;
  Instr *instrMovArg1;
  Instr *mov;
  RegOpnd *entryPointRegOpnd;
  Instr *mov_1;
  IndirOpnd *functionTypeIndirOpnd;
  uint32 entryPointOffset;
  Instr *instr;
  IndirOpnd *functionInfoIndirOpnd;
  IndirOpnd *entryPointIndirOpnd;
  RegOpnd *functionTypeRegOpnd;
  Instr *insertBeforeInstrForCFGCheck_local;
  Opnd *functionObjOpnd_local;
  Instr *callInstr_local;
  LowererMDArch *this_local;
  
  functionTypeRegOpnd = (RegOpnd *)insertBeforeInstrForCFGCheck;
  if (insertBeforeInstrForCFGCheck == (Instr *)0x0) {
    functionTypeRegOpnd = (RegOpnd *)callInstr;
  }
  entryPointIndirOpnd = (IndirOpnd *)0x0;
  if (callInstr->m_opcode == AsmJsCallI) {
    entryPointIndirOpnd = (IndirOpnd *)IR::RegOpnd::New(TyInt64,this->m_func);
    pRVar5 = IR::Opnd::AsRegOpnd(functionObjOpnd);
    uVar3 = Js::RecyclableObject::GetOffsetOfType();
    pIVar6 = IR::IndirOpnd::New(pRVar5,uVar3,TyInt64,this->m_func,false);
    pIVar7 = IR::Instr::New(MOV,(Opnd *)entryPointIndirOpnd,&pIVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore((Instr *)functionTypeRegOpnd,pIVar7);
    DVar4 = Js::ScriptFunctionType::GetEntryPointInfoOffset();
    pIVar6 = IR::IndirOpnd::New((RegOpnd *)entryPointIndirOpnd,DVar4,TyInt64,this->m_func,false);
    pIVar7 = IR::Instr::New(MOV,(Opnd *)entryPointIndirOpnd,&pIVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore((Instr *)functionTypeRegOpnd,pIVar7);
    DVar4 = Js::ProxyEntryPointInfo::GetAddressOffset();
    functionInfoIndirOpnd =
         IR::IndirOpnd::New((RegOpnd *)entryPointIndirOpnd,DVar4,TyInt64,this->m_func,false);
  }
  else {
    bVar2 = IR::Opnd::IsAddrOpnd(functionObjOpnd);
    if ((bVar2) &&
       (pAVar8 = IR::Opnd::AsAddrOpnd(functionObjOpnd), ((byte)pAVar8->field_0x28 >> 1 & 1) != 0)) {
      entryPointIndirOpnd =
           (IndirOpnd *)
           Lowerer::GenerateFunctionTypeFromFixedFunctionObject
                     (this->lowererMD->m_lowerer,(Instr *)functionTypeRegOpnd,functionObjOpnd);
    }
    else {
      bVar2 = IR::Opnd::IsRegOpnd(functionObjOpnd);
      if (bVar2) {
        pRVar5 = IR::Opnd::AsRegOpnd(functionObjOpnd);
        bVar2 = Sym::IsStackSym(&pRVar5->m_sym->super_Sym);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                             ,0x2c2,"(functionObjOpnd->AsRegOpnd()->m_sym->IsStackSym())",
                             "Expected call target to be a stack symbol.");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        entryPointIndirOpnd = (IndirOpnd *)IR::RegOpnd::New(TyInt64,this->m_func);
        pRVar5 = IR::Opnd::AsRegOpnd(functionObjOpnd);
        DVar4 = Js::DynamicObject::GetOffsetOfType();
        pIVar6 = IR::IndirOpnd::New(pRVar5,DVar4,TyInt64,this->m_func,false);
        pIVar7 = IR::Instr::New(MOV,(Opnd *)entryPointIndirOpnd,&pIVar6->super_Opnd,this->m_func);
        IR::Instr::InsertBefore((Instr *)functionTypeRegOpnd,pIVar7);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x2cf,"(false)","Unexpected call target operand type.");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
    uVar3 = Js::Type::GetOffsetOfEntryPoint();
    functionInfoIndirOpnd =
         IR::IndirOpnd::New((RegOpnd *)entryPointIndirOpnd,uVar3,TyUint64,this->m_func,false);
  }
  *(byte *)&entryPointIndirOpnd->m_indexOpnd = *(byte *)&entryPointIndirOpnd->m_indexOpnd & 0xfd | 2
  ;
  pIVar7 = IR::Instr::New(MOV,&entryPointIndirOpnd->super_Opnd,&functionInfoIndirOpnd->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore((Instr *)functionTypeRegOpnd,pIVar7);
  IR::Instr::SetSrc1(callInstr,&entryPointIndirOpnd->super_Opnd);
  dstOpnd = GetArgSlotOpnd(this,1,(StackSym *)0x0,false);
  pIVar7 = IR::Instr::New(MOV,dstOpnd,functionObjOpnd,this->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar7);
  return;
}

Assistant:

void
LowererMDArch::GeneratePreCall(IR::Instr * callInstr, IR::Opnd  *functionObjOpnd, IR::Instr * insertBeforeInstrForCFGCheck)
{
    if (insertBeforeInstrForCFGCheck == nullptr)
    {
        insertBeforeInstrForCFGCheck = callInstr;
    }

    IR::RegOpnd * functionTypeRegOpnd = nullptr;
    IR::IndirOpnd * entryPointIndirOpnd = nullptr;
    if (callInstr->m_opcode == Js::OpCode::AsmJsCallI)
    {
        functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);

        IR::IndirOpnd* functionInfoIndirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func);

        IR::Instr* instr = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionInfoIndirOpnd, m_func);

        insertBeforeInstrForCFGCheck->InsertBefore(instr);

        functionInfoIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, Js::ScriptFunctionType::GetEntryPointInfoOffset(), TyMachReg, m_func);
        instr = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionInfoIndirOpnd, m_func);
        insertBeforeInstrForCFGCheck->InsertBefore(instr);

        uint32 entryPointOffset = Js::ProxyEntryPointInfo::GetAddressOffset();

        entryPointIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, entryPointOffset, TyMachReg, m_func);
    }
    else
    {
        // For calls to fixed functions we load the function's type directly from the known (hard-coded) function object address.
        // For other calls, we need to load it from the function object stored in a register operand.
        if (functionObjOpnd->IsAddrOpnd() && functionObjOpnd->AsAddrOpnd()->m_isFunction)
        {
            functionTypeRegOpnd = this->lowererMD->m_lowerer->GenerateFunctionTypeFromFixedFunctionObject(insertBeforeInstrForCFGCheck, functionObjOpnd);
        }
        else if (functionObjOpnd->IsRegOpnd())
        {
            AssertMsg(functionObjOpnd->AsRegOpnd()->m_sym->IsStackSym(), "Expected call target to be a stack symbol.");

            functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);
            // functionTypeRegOpnd(RAX) = MOV function->type
            {
                IR::IndirOpnd * functionTypeIndirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(),
                    Js::DynamicObject::GetOffsetOfType(), TyMachReg, m_func);
                IR::Instr * mov = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionTypeIndirOpnd, m_func);
                insertBeforeInstrForCFGCheck->InsertBefore(mov);
            }
        }
        else
        {
            AnalysisAssertMsg(false, "Unexpected call target operand type.");
        }
        // entryPointRegOpnd(RAX) = MOV type->entryPoint
        entryPointIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, Js::Type::GetOffsetOfEntryPoint(), TyMachPtr, m_func);
    }

    IR::RegOpnd *entryPointRegOpnd = functionTypeRegOpnd;
    entryPointRegOpnd->m_isCallArg = true;

    IR::Instr *mov = IR::Instr::New(Js::OpCode::MOV, entryPointRegOpnd, entryPointIndirOpnd, m_func);
    insertBeforeInstrForCFGCheck->InsertBefore(mov);

    // entryPointRegOpnd(RAX) = CALL entryPointRegOpnd(RAX)
    callInstr->SetSrc1(entryPointRegOpnd);

#if defined(_CONTROL_FLOW_GUARD)
    // verify that the call target is valid (CFG Check)
    if (!PHASE_OFF(Js::CFGInJitPhase, this->m_func))
    {
        this->lowererMD->GenerateCFGCheck(entryPointRegOpnd, insertBeforeInstrForCFGCheck);
    }
#endif

    // Setup the first call argument - pointer to the function being called.
    IR::Instr * instrMovArg1 = IR::Instr::New(Js::OpCode::MOV, GetArgSlotOpnd(1), functionObjOpnd, m_func);
    callInstr->InsertBefore(instrMovArg1);
}